

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_avx2.c
# Opt level: O1

parasail_profile_t *
parasail_profile_create_stats_avx_256_64(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  long *plVar1;
  ulong *puVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  parasail_profile_t *ppVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  size_t size;
  byte *pbVar19;
  __m256i_64_t p;
  __m256i_64_t s;
  __m256i_64_t m;
  long local_c0 [4];
  ulong local_a0 [4];
  ulong local_80 [10];
  int iVar10;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_profile_create_stats_avx_256_64_cold_2();
  }
  else if (s1 == (char *)0x0) {
    parasail_profile_create_stats_avx_256_64_cold_1();
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
    }
    uVar3 = matrix->size;
    iVar10 = _s1Len + 6;
    if (-1 < _s1Len + 3) {
      iVar10 = _s1Len + 3;
    }
    uVar9 = iVar10 >> 2;
    size = (long)(int)(uVar9 * uVar3) << 5;
    pvVar4 = parasail_memalign(0x20,size);
    if ((((pvVar4 != (void *)0x0) && (pvVar5 = parasail_memalign(0x20,size), pvVar5 != (void *)0x0))
        && (pvVar6 = parasail_memalign(0x20,size), pvVar6 != (void *)0x0)) &&
       (ppVar7 = parasail_profile_new(s1,_s1Len,matrix), ppVar7 != (parasail_profile_t *)0x0)) {
      if (0 < (int)uVar3) {
        uVar8 = 1;
        if (1 < (int)uVar9) {
          uVar8 = (ulong)uVar9;
        }
        uVar11 = 0;
        lVar14 = 0;
        do {
          if (0 < _s1Len) {
            lVar14 = (long)(int)lVar14;
            uVar15 = 0;
            do {
              iVar10 = matrix->type;
              lVar18 = 0;
              uVar17 = uVar15;
              do {
                iVar16 = (int)uVar17;
                if (iVar10 == 0) {
                  if (iVar16 < _s1Len) {
                    pbVar19 = (byte *)(s1 + uVar17);
                    uVar13 = uVar11;
                    goto LAB_0077bca0;
                  }
LAB_0077bcc1:
                  lVar12 = 0;
                }
                else {
                  if (_s1Len <= iVar16) goto LAB_0077bcc1;
                  pbVar19 = (byte *)(matrix->alphabet + uVar11);
                  uVar13 = uVar17;
LAB_0077bca0:
                  lVar12 = (long)matrix->matrix
                                 [(long)(int)((int)uVar13 * uVar3) + (long)matrix->mapper[*pbVar19]]
                  ;
                }
                local_c0[lVar18] = lVar12;
                if (iVar16 < _s1Len) {
                  uVar13 = (ulong)(uVar11 == (uint)matrix->mapper[(byte)s1[uVar17]]);
                }
                else {
                  uVar13 = 0;
                }
                local_80[lVar18] = uVar13;
                local_a0[lVar18] = (ulong)(0 < local_c0[lVar18]);
                uVar17 = uVar17 + uVar9;
                lVar18 = lVar18 + 1;
              } while (lVar18 != 4);
              lVar18 = lVar14 * 0x20;
              plVar1 = (long *)((long)pvVar4 + lVar18);
              *plVar1 = local_c0[0];
              plVar1[1] = local_c0[1];
              plVar1[2] = local_c0[2];
              plVar1[3] = local_c0[3];
              puVar2 = (ulong *)((long)pvVar5 + lVar18);
              *puVar2 = local_80[0];
              puVar2[1] = local_80[1];
              puVar2[2] = local_80[2];
              puVar2[3] = local_80[3];
              puVar2 = (ulong *)((long)pvVar6 + lVar18);
              *puVar2 = local_a0[0];
              puVar2[1] = local_a0[1];
              puVar2[2] = local_a0[2];
              puVar2[3] = local_a0[3];
              lVar14 = lVar14 + 1;
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar8);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar3);
      }
      (ppVar7->profile64).score = pvVar4;
      (ppVar7->profile64).matches = pvVar5;
      (ppVar7->profile64).similar = pvVar6;
      ppVar7->free = parasail_free___m256i;
      return ppVar7;
    }
  }
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_stats_avx_256_64(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0;
    const int32_t segWidth = 4; /* number of values in vector unit */
    int32_t segLen = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is required for both pssm and square */
    PARASAIL_CHECK_NULL(s1);

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size; /* number of amino acids in table */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m256i(32, n * segLen);
    if (!vProfile) return NULL;
    vProfileM = parasail_memalign___m256i(32, n * segLen);
    if (!vProfileM) return NULL;
    vProfileS = parasail_memalign___m256i(32, n * segLen);
    if (!vProfileS) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m256i_64_t p;
            __m256i_64_t m;
            __m256i_64_t s;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                m.v[segNum] = j >= s1Len ? 0 : (k == matrix->mapper[(unsigned char)s1[j]]);
                s.v[segNum] = p.v[segNum] > 0;
                j += segLen;
            }
            _mm256_store_si256(&vProfile[index], p.m);
            _mm256_store_si256(&vProfileM[index], m.m);
            _mm256_store_si256(&vProfileS[index], s.m);
            ++index;
        }
    }

    profile->profile64.score = vProfile;
    profile->profile64.matches = vProfileM;
    profile->profile64.similar = vProfileS;
    profile->free = &parasail_free___m256i;
    return profile;
}